

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

bool __thiscall Loop::IsSymAssignedToInSelfOrParents(Loop *this,StackSym *sym)

{
  BVIndex i;
  BOOLEAN BVar1;
  Loop *curLoop;
  
  i = (sym->super_Sym).m_id;
  do {
    BVar1 = BVSparse<Memory::JitArenaAllocator>::Test(this->symsAssignedToInLoop,i);
    if (BVar1 != '\0') break;
    this = this->parent;
  } while (this != (Loop *)0x0);
  return BVar1 != '\0';
}

Assistant:

bool
Loop::IsSymAssignedToInSelfOrParents(StackSym * const sym) const
{
    return IsSymAssignedToInSelfOrParents(sym->m_id);
}